

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
               Byte *propsEncoded,SizeT *propsSize,int writeEndMark,ICompressProgress *progress,
               ISzAlloc *alloc,ISzAlloc *allocBig)

{
  CLzmaEncHandle pp;
  SizeT *in_RCX;
  CLzmaEncProps *in_RDX;
  CLzmaEncHandle in_RSI;
  Byte *in_R8;
  Byte *in_R9;
  ICompressProgress *unaff_retaddr;
  ISzAlloc *in_stack_00000008;
  ISzAlloc *in_stack_00000010;
  ISzAlloc *in_stack_00000018;
  ISzAlloc *in_stack_00000020;
  SRes res;
  CLzmaEnc *p;
  ISzAlloc *in_stack_ffffffffffffff98;
  ISzAlloc *in_stack_ffffffffffffffa0;
  SRes local_44;
  SRes local_4;
  
  pp = LzmaEnc_Create(in_stack_ffffffffffffffa0);
  if (pp == (CLzmaEncHandle)0x0) {
    local_4 = 2;
  }
  else {
    local_44 = LzmaEnc_SetProps(in_RSI,in_RDX);
    if ((local_44 == 0) &&
       (local_44 = LzmaEnc_WriteProperties(pp,in_R9,(SizeT *)in_stack_00000008), local_44 == 0)) {
      local_44 = LzmaEnc_MemEncode(in_RSI,(Byte *)in_RDX,in_RCX,in_R8,(SizeT)in_R9,
                                   (int)((ulong)pp >> 0x20),unaff_retaddr,in_stack_00000008,
                                   in_stack_00000010);
      in_stack_ffffffffffffff98 = in_stack_00000018;
      in_stack_ffffffffffffffa0 = in_stack_00000020;
    }
    LzmaEnc_Destroy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(ISzAlloc *)0x11a84c);
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

SRes LzmaEncode(Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    const CLzmaEncProps *props, Byte *propsEncoded, SizeT *propsSize, int writeEndMark,
    ICompressProgress *progress, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  CLzmaEnc *p = (CLzmaEnc *)LzmaEnc_Create(alloc);
  SRes res;
  if (!p)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK)
  {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
          writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}